

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_write(archive_write_filter *f,void *buff,size_t length)

{
  private_data_conflict6 *data_00;
  uLong uVar1;
  int ret;
  private_data_conflict6 *data;
  size_t length_local;
  void *buff_local;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict6 *)f->data;
  uVar1 = cm_zlib_crc32(data_00->crc,(uchar *)buff,(uint)length);
  data_00->crc = uVar1;
  data_00->total_in = length + data_00->total_in;
  (data_00->stream).next_in = (Bytef *)buff;
  (data_00->stream).avail_in = (uint)length;
  f_local._4_4_ = drive_compressor(f,data_00,0);
  if (f_local._4_4_ == 0) {
    f_local._4_4_ = 0;
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_gzip_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->crc = crc32(data->crc, (const Bytef *)buff, (uInt)length);
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = (uInt)length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}